

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void update_search_state(InterModeSearchState *search_state,RD_STATS *best_rd_stats_dst,
                        PICK_MODE_CONTEXT *ctx,RD_STATS *new_best_rd_stats,
                        RD_STATS *new_best_rd_stats_y,RD_STATS *new_best_rd_stats_uv,
                        THR_MODES new_best_mode,MACROBLOCK *x,int txfm_search_done)

{
  byte bVar1;
  MB_MODE_INFO *__src;
  int64_t iVar2;
  int64_t iVar3;
  undefined7 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  
  __src = *(x->e_mbd).mi;
  uVar7 = av1_get_skip_txfm_context(&x->e_mbd);
  if (__src->skip_txfm == '\0') {
    bVar8 = false;
  }
  else {
    bVar8 = 0xc < av1_mode_defs[new_best_mode].mode;
  }
  search_state->best_rd = new_best_rd_stats->rdcost;
  search_state->best_mode_index = new_best_mode;
  uVar4 = *(undefined7 *)&new_best_rd_stats->field_0x21;
  best_rd_stats_dst->skip_txfm = new_best_rd_stats->skip_txfm;
  *(undefined7 *)&best_rd_stats_dst->field_0x21 = uVar4;
  iVar5 = new_best_rd_stats->rate;
  iVar6 = new_best_rd_stats->zero_rate;
  iVar2 = new_best_rd_stats->dist;
  iVar3 = new_best_rd_stats->sse;
  best_rd_stats_dst->rdcost = new_best_rd_stats->rdcost;
  best_rd_stats_dst->sse = iVar3;
  best_rd_stats_dst->rate = iVar5;
  best_rd_stats_dst->zero_rate = iVar6;
  best_rd_stats_dst->dist = iVar2;
  memcpy(&search_state->best_mbmode,__src,0xb0);
  search_state->best_skip2 = (uint)bVar8;
  bVar1 = new_best_rd_stats->skip_txfm;
  search_state->best_mode_skippable = (uint)bVar1;
  if (txfm_search_done != 0) {
    search_state->best_rate_y =
         (x->mode_costs).skip_txfm_cost[uVar7][(byte)(bVar1 != 0 | bVar8)] +
         new_best_rd_stats_y->rate;
    search_state->best_rate_uv = new_best_rd_stats_uv->rate;
  }
  uVar4 = *(undefined7 *)&new_best_rd_stats_y->field_0x21;
  (search_state->best_y_rdcost).skip_txfm = new_best_rd_stats_y->skip_txfm;
  *(undefined7 *)&(search_state->best_y_rdcost).field_0x21 = uVar4;
  iVar5 = new_best_rd_stats_y->rate;
  iVar6 = new_best_rd_stats_y->zero_rate;
  iVar2 = new_best_rd_stats_y->dist;
  iVar3 = new_best_rd_stats_y->sse;
  (search_state->best_y_rdcost).rdcost = new_best_rd_stats_y->rdcost;
  (search_state->best_y_rdcost).sse = iVar3;
  (search_state->best_y_rdcost).rate = iVar5;
  (search_state->best_y_rdcost).zero_rate = iVar6;
  (search_state->best_y_rdcost).dist = iVar2;
  memcpy(ctx->blk_skip,(x->txfm_search_info).blk_skip,(long)ctx->num_4x4_blk);
  memcpy(ctx->tx_type_map,(x->e_mbd).tx_type_map,(long)ctx->num_4x4_blk);
  return;
}

Assistant:

static inline void update_search_state(
    InterModeSearchState *search_state, RD_STATS *best_rd_stats_dst,
    PICK_MODE_CONTEXT *ctx, const RD_STATS *new_best_rd_stats,
    const RD_STATS *new_best_rd_stats_y, const RD_STATS *new_best_rd_stats_uv,
    THR_MODES new_best_mode, const MACROBLOCK *x, int txfm_search_done) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int skip_txfm =
      mbmi->skip_txfm && !is_mode_intra(av1_mode_defs[new_best_mode].mode);
  const TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  search_state->best_rd = new_best_rd_stats->rdcost;
  search_state->best_mode_index = new_best_mode;
  *best_rd_stats_dst = *new_best_rd_stats;
  search_state->best_mbmode = *mbmi;
  search_state->best_skip2 = skip_txfm;
  search_state->best_mode_skippable = new_best_rd_stats->skip_txfm;
  // When !txfm_search_done, new_best_rd_stats won't provide correct rate_y and
  // rate_uv because av1_txfm_search process is replaced by rd estimation.
  // Therefore, we should avoid updating best_rate_y and best_rate_uv here.
  // These two values will be updated when av1_txfm_search is called.
  if (txfm_search_done) {
    search_state->best_rate_y =
        new_best_rd_stats_y->rate +
        x->mode_costs.skip_txfm_cost[skip_ctx]
                                    [new_best_rd_stats->skip_txfm || skip_txfm];
    search_state->best_rate_uv = new_best_rd_stats_uv->rate;
  }
  search_state->best_y_rdcost = *new_best_rd_stats_y;
  memcpy(ctx->blk_skip, txfm_info->blk_skip,
         sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
  av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
}